

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_oct(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  uint uVar1;
  undefined1 n [16];
  string_view prefix;
  int num_digits_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  char *in_RDI;
  size_t unaff_retaddr;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_00000008;
  anon_class_16_2_cb75083a_for_f_conflict1 in_stack_00000020;
  int num_digits;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  basic_format_specs<char> *in_stack_ffffffffffffffe8;
  char *pcVar3;
  
  n._8_8_ = in_stack_ffffffffffffff90;
  n._0_8_ = in_stack_ffffffffffffff88;
  pcVar3 = in_RDI;
  num_digits_00 =
       count_digits<3u,unsigned__int128>(*(detail **)(in_RDI + 0x20),(unsigned___int128)n);
  if (((*(char *)(*(long *)(in_RDI + 0x10) + 9) < '\0') &&
      (*(int *)(*(long *)(in_RDI + 0x10) + 4) <= num_digits_00)) &&
     (*(long *)(in_RDI + 0x20) != 0 || *(long *)(in_RDI + 0x28) != 0)) {
    uVar1 = *(uint *)(in_RDI + 0x34);
    *(uint *)(in_RDI + 0x34) = uVar1 + 1;
    in_RDI[(ulong)uVar1 + 0x30] = '0';
  }
  get_prefix((int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
              *)0x279ce4);
  prefix.size_ = unaff_retaddr;
  prefix.data_ = pcVar3;
  bVar2 = write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>::on_oct()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>
                    (in_stack_00000008,num_digits_00,prefix,in_stack_ffffffffffffffe8,
                     in_stack_00000020);
  *(buffer<char> **)in_RDI = bVar2.container;
  return;
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }